

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest13::verifyReadBuffer
          (FunctionalTest13 *this,uint n_fs_id,uint n_fs_subroutine,uint n_gs_id,
          uint n_gs_subroutine,uint n_tc_id,uint n_tc_subroutine,uint n_te_id,uint n_te_subroutine,
          uint n_vs_id,uint n_vs_subroutine)

{
  ostringstream *this_00;
  uchar *puVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  uint n_component;
  long lVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fs_modifier [4];
  float vs_modifier [4];
  float te_modifier [4];
  float tc_modifier [4];
  ulong local_2a8;
  float local_288 [8];
  double local_268;
  double local_260;
  double local_258;
  double local_250;
  ulong local_248;
  ulong local_240;
  ulong local_238;
  ulong local_230;
  ulong local_228;
  ulong local_220;
  ulong local_218;
  ulong local_210;
  ulong local_208;
  ulong local_200;
  ulong local_1f8 [2];
  float local_1e8 [2];
  ulong uStack_1e0;
  long local_1d8 [2];
  float local_1c8 [2];
  long lStack_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_288[0] = 0.0;
  local_288[1] = 0.0;
  local_288[2] = 0.0;
  local_288[3] = 0.0;
  local_288[4] = 0.0;
  local_288[5] = 0.0;
  local_288[6] = 0.0;
  local_288[7] = 0.0;
  local_1c8[0] = 0.0;
  local_1c8[1] = 0.0;
  local_1d8[1] = 0;
  local_1e8[0] = 0.0;
  local_1e8[1] = 0.0;
  local_1f8[1] = 0;
  lVar10 = 0;
  if (n_fs_subroutine == 0) {
    do {
      local_288[lVar10 + 4] = (float)(n_fs_id + 1 + (int)lVar10) / 10.0;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 4);
  }
  else {
    do {
      local_288[lVar10 + 4] = (float)(n_fs_id + 1 + (int)lVar10) / 20.0;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 4);
  }
  lStack_1c0 = (ulong)(uint)((float)(n_gs_id + 1) *
                            *(float *)(&DAT_01a9ade0 + (ulong)(n_gs_subroutine == 0) * 4)) << 0x20;
  local_1d8[0] = (ulong)(uint)((float)(n_tc_id + 1) *
                              *(float *)(&DAT_01a9ade8 + (ulong)(n_tc_subroutine == 0) * 4)) << 0x20
  ;
  uStack_1e0 = (ulong)(uint)((float)(n_te_id + 1) *
                            *(float *)(&DAT_01a9adf0 + (ulong)(n_te_subroutine == 0) * 4));
  local_1f8[0] = (ulong)(uint)((float)(n_vs_id + 1) *
                              *(float *)(&DAT_01a9adf8 + (ulong)(n_vs_subroutine == 0) * 4));
  lVar10 = 0;
  do {
    *(float *)((long)local_288 + lVar10) =
         *(float *)((long)local_288 + lVar10 + 0x10) + *(float *)((long)local_1c8 + lVar10) +
         *(float *)((long)local_1d8 + lVar10) + *(float *)((long)local_1e8 + lVar10) +
         *(float *)((long)local_1f8 + lVar10);
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0x10);
  if (this->m_to_height != 0) {
    fVar3 = local_288[0];
    fVar4 = local_288[1];
    fVar5 = local_288[2];
    fVar6 = local_288[3];
    this_00 = (ostringstream *)(local_1b0 + 8);
    local_200 = (ulong)n_fs_id;
    local_208 = (ulong)n_fs_subroutine;
    local_210 = (ulong)n_gs_id;
    local_218 = (ulong)n_gs_subroutine;
    local_220 = (ulong)n_tc_id;
    local_228 = (ulong)n_tc_subroutine;
    local_230 = (ulong)n_te_id;
    local_238 = (ulong)n_te_subroutine;
    local_240 = (ulong)n_vs_id;
    local_248 = (ulong)n_vs_subroutine;
    local_250 = (double)local_288[0];
    local_258 = (double)local_288[1];
    local_260 = (double)local_288[2];
    local_268 = (double)local_288[3];
    bVar2 = true;
    local_2a8 = 0;
    do {
      if ((bool)(this->m_to_width != 0 & bVar2)) {
        iVar8 = this->m_to_width * (int)local_2a8;
        puVar1 = this->m_read_buffer;
        uVar7 = 0;
        uVar11 = 0;
        do {
          uVar9 = (ulong)uVar7;
          fVar12 = *(float *)(puVar1 + uVar9 * 4 + (ulong)(uint)(iVar8 * 4) * 4) - fVar3;
          fVar13 = -fVar12;
          if (-fVar12 <= fVar12) {
            fVar13 = fVar12;
          }
          if (1e-05 < fVar13) {
LAB_009848da:
            local_1b0._0_8_ =
                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream(this_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,"Invalid texel rendered at (",0x1b);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,") for the following configuration: n_fs_id:",0x2b);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00," n_fs_subroutine:",0x11);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," n_gs_id:",9);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00," n_gs_subroutine:",0x11);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," n_tc_id:",9);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00," n_tc_subroutine:",0x11);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," n_te_id:",9);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00," n_te_subroutine:",0x11);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," n_vs_id:",9);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00," n_vs_subroutine:",0x11);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,"; expected:(",0xc);
            std::ostream::_M_insert<double>(local_250);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
            std::ostream::_M_insert<double>(local_258);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
            std::ostream::_M_insert<double>(local_260);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
            std::ostream::_M_insert<double>(local_268);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"), found:(",10);
            std::ostream::_M_insert<double>
                      ((double)*(float *)(puVar1 + uVar9 * 4 + (ulong)(uint)(iVar8 * 4) * 4));
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
            std::ostream::_M_insert<double>
                      ((double)*(float *)(puVar1 + uVar9 * 4 + (ulong)(uint)(iVar8 * 4) * 4 + 4));
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
            std::ostream::_M_insert<double>
                      ((double)*(float *)(puVar1 + uVar9 * 4 + (ulong)(uint)(iVar8 * 4) * 4 + 8));
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
            std::ostream::_M_insert<double>
                      ((double)*(float *)(puVar1 + uVar9 * 4 + (ulong)(uint)(iVar8 * 4) * 4 + 0xc));
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,").",2);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(this_00);
            std::ios_base::~ios_base(local_138);
            this->m_has_test_passed = false;
            bVar2 = false;
          }
          else {
            fVar12 = *(float *)(puVar1 + uVar9 * 4 + (ulong)(uint)(iVar8 * 4) * 4 + 4) - fVar4;
            fVar13 = -fVar12;
            if (-fVar12 <= fVar12) {
              fVar13 = fVar12;
            }
            if (1e-05 < fVar13) goto LAB_009848da;
            fVar12 = *(float *)(puVar1 + uVar9 * 4 + (ulong)(uint)(iVar8 * 4) * 4 + 8) - fVar5;
            fVar13 = -fVar12;
            if (-fVar12 <= fVar12) {
              fVar13 = fVar12;
            }
            if (1e-05 < fVar13) goto LAB_009848da;
            fVar12 = *(float *)(puVar1 + uVar9 * 4 + (ulong)(uint)(iVar8 * 4) * 4 + 0xc) - fVar6;
            fVar13 = -fVar12;
            if (-fVar12 <= fVar12) {
              fVar13 = fVar12;
            }
            if (1e-05 < fVar13) goto LAB_009848da;
          }
          uVar11 = uVar11 + 1;
        } while ((uVar11 < this->m_to_width) && (uVar7 = uVar7 + 4, bVar2));
      }
      local_2a8 = local_2a8 + 1;
    } while ((local_2a8 < this->m_to_height) && (bVar2));
  }
  return;
}

Assistant:

void FunctionalTest13::verifyReadBuffer(unsigned int n_fs_id, unsigned int n_fs_subroutine, unsigned int n_gs_id,
										unsigned int n_gs_subroutine, unsigned int n_tc_id,
										unsigned int n_tc_subroutine, unsigned int n_te_id,
										unsigned int n_te_subroutine, unsigned int n_vs_id,
										unsigned int n_vs_subroutine)
{
	float expected_color[4] = { 0 };
	float fs_modifier[4]	= { 0 };
	float gs_modifier[4]	= { 0 };
	float tc_modifier[4]	= { 0 };
	float te_modifier[4]	= { 0 };
	float vs_modifier[4]	= { 0 };

	if (n_fs_subroutine == 0)
	{
		for (unsigned int n_component = 0; n_component < 4; ++n_component)
		{
			fs_modifier[n_component] = float(n_fs_id + n_component + 1) / 10.0f;
		}
	}
	else
	{
		for (unsigned int n_component = 0; n_component < 4; ++n_component)
		{
			fs_modifier[n_component] = float(n_fs_id + n_component + 1) / 20.0f;
		}
	}

	if (n_gs_subroutine == 0)
	{
		gs_modifier[3] = float(n_gs_id + 1) * 0.425f;
	}
	else
	{
		gs_modifier[3] = float(n_gs_id + 1) * 0.0425f;
	}

	if (n_tc_subroutine == 0)
	{
		tc_modifier[1] = float(n_tc_id + 1) * 0.25f;
	}
	else
	{
		tc_modifier[1] = float(n_tc_id + 1) * 0.025f;
	}

	if (n_te_subroutine == 0)
	{
		te_modifier[2] = float(n_te_id + 1) * 0.325f;
	}
	else
	{
		te_modifier[2] = float(n_te_id + 1) * 0.0325f;
	}

	if (n_vs_subroutine == 0)
	{
		vs_modifier[0] = float(n_vs_id + 1) * 0.125f;
	}
	else
	{
		vs_modifier[0] = float(n_vs_id + 1) * 0.0125f;
	}

	/* Determine the expected color */
	for (unsigned int n_component = 0; n_component < 4 /* rgba */; ++n_component)
	{
		expected_color[n_component] = fs_modifier[n_component] + gs_modifier[n_component] + tc_modifier[n_component] +
									  te_modifier[n_component] + vs_modifier[n_component];
	}

	/* Verify all read texels are valid */
	const float epsilon			= 1e-5f;
	bool		should_continue = true;

	for (unsigned int y = 0; y < m_to_height && should_continue; ++y)
	{
		const float* row_ptr = (const float*)m_read_buffer + y * m_to_width * 4; /* rgba */

		for (unsigned int x = 0; x < m_to_width && should_continue; ++x)
		{
			const float* texel_ptr = row_ptr + x * 4; /* rgba */

			if (de::abs(texel_ptr[0] - expected_color[0]) > epsilon ||
				de::abs(texel_ptr[1] - expected_color[1]) > epsilon ||
				de::abs(texel_ptr[2] - expected_color[2]) > epsilon ||
				de::abs(texel_ptr[3] - expected_color[3]) > epsilon)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Invalid texel rendered at (" << x << ", " << y
								   << ") for "
									  "the following configuration: "
									  "n_fs_id:"
								   << n_fs_id << " n_fs_subroutine:" << n_fs_subroutine << " n_gs_id:" << n_gs_id
								   << " n_gs_subroutine:" << n_gs_subroutine << " n_tc_id:" << n_tc_id
								   << " n_tc_subroutine:" << n_tc_subroutine << " n_te_id:" << n_te_id
								   << " n_te_subroutine:" << n_te_subroutine << " n_vs_id:" << n_vs_id
								   << " n_vs_subroutine:" << n_vs_subroutine << "; expected:"
																				"("
								   << expected_color[0] << ", " << expected_color[1] << ", " << expected_color[2]
								   << ", " << expected_color[3] << "), found:"
																   "("
								   << texel_ptr[0] << ", " << texel_ptr[1] << ", " << texel_ptr[2] << ", "
								   << texel_ptr[3] << ")." << tcu::TestLog::EndMessage;

				m_has_test_passed = false;
				should_continue   = false;
			}
		} /* for (all columns) */
	}	 /* for (all rows) */
}